

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

size_t MeCab::tokenize<char**>(char *str,char *del,char **out,size_t max)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  ulong in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *n;
  size_t size;
  char *dele;
  char *stre;
  ulong local_38;
  undefined8 *local_18;
  char *local_8;
  
  sVar1 = strlen(in_RDI);
  sVar2 = strlen(in_RSI);
  local_38 = 0;
  local_18 = in_RDX;
  local_8 = in_RDI;
  while( true ) {
    if (in_RCX <= local_38) {
      return local_38;
    }
    pcVar3 = std::find_first_of<char*,char_const*>(local_8,in_RDI + sVar1,in_RSI,in_RSI + sVar2);
    *pcVar3 = '\0';
    *local_18 = local_8;
    local_38 = local_38 + 1;
    if (pcVar3 == in_RDI + sVar1) break;
    local_8 = pcVar3 + 1;
    local_18 = local_18 + 1;
  }
  return local_38;
}

Assistant:

inline size_t tokenize(char *str, const char *del,
                       Iterator out, size_t max) {
  char *stre = str + std::strlen(str);
  const char *dele = del + std::strlen(del);
  size_t size = 0;

  while (size < max) {
    char *n = std::find_first_of(str, stre, del, dele);
    *n = '\0';
    *out++ = str;
    ++size;
    if (n == stre) break;
    str = n + 1;
  }

  return size;
}